

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bias.cpp
# Opt level: O0

void CoreMLConverter::convertCaffeBias(ConvertLayerParameters layerParameters)

{
  uint64 uVar1;
  uint64 value;
  RepeatedField<float> *this;
  bool bVar2;
  int iVar3;
  int32 iVar4;
  string *psVar5;
  string *psVar6;
  BlobProto *pBVar7;
  BlobShape *pBVar8;
  reference pvVar9;
  int64 iVar10;
  NeuralNetworkLayer *this_00;
  BiasLayerParams *this_01;
  WeightParams *this_02;
  RepeatedField<float> *other;
  NetParameter *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  NeuralNetworkLayer *local_2f8;
  NeuralNetworkLayer *specLayer_1;
  RepeatedField<float> *local_2e8;
  RepeatedField<float> *biasWrite;
  long *dim;
  iterator __end2;
  iterator __begin2;
  vector<long,_std::allocator<long>_> *__range2;
  BiasLayerParams *specLayerParams;
  NeuralNetworkLayer *specLayer;
  string local_2a8;
  allocator local_281;
  string local_280;
  allocator local_259;
  string local_258;
  allocator local_231;
  string local_230;
  allocator local_209;
  string local_208;
  int64 local_1e8;
  int64 local_1e0;
  int64 local_1d8;
  int64 local_1d0;
  int64 local_1c8;
  int64 local_1c0;
  int local_1b8;
  int local_1b4;
  int dimSize;
  int biasSize;
  vector<long,_std::allocator<long>_> biasShape;
  string local_190;
  allocator local_169;
  string local_168;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  int local_d4;
  undefined1 local_d0 [4];
  int nBottom;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *nnWrite;
  string local_90;
  allocator local_59;
  string local_58;
  BiasParameter *local_38;
  BiasParameter *caffeLayerParams;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *mappingDataBlobNames;
  LayerParameter *caffeLayerWeights;
  LayerParameter *pLStack_18;
  int layerIdWeights;
  LayerParameter *caffeLayer;
  int layerId;
  
  caffeLayer._4_4_ = *(int *)&((layerParameters.caffeNetworkInputNames)->_M_t)._M_impl;
  pLStack_18 = caffe::NetParameter::layer(in_stack_00000008,caffeLayer._4_4_);
  caffeLayerWeights._4_4_ =
       getLayerIndex(pLStack_18,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *)layerParameters.mappingDataBlobNames);
  mappingDataBlobNames =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)caffe::NetParameter::layer(layerParameters.prototxt,caffeLayerWeights._4_4_);
  caffeLayerParams = (BiasParameter *)layerParameters._24_8_;
  local_38 = caffe::LayerParameter::bias_param(pLStack_18);
  caffe::LayerParameter::bottom_size(pLStack_18);
  iVar3 = caffe::LayerParameter::bottom_size(pLStack_18);
  if ((iVar3 != 1) && (iVar3 = caffe::LayerParameter::bottom_size(pLStack_18), iVar3 != 2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"Must have 1 or 2 input(s)",&local_59);
    psVar5 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar6 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    errorInCaffeProto(&local_58,psVar5,psVar6);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  iVar3 = caffe::LayerParameter::top_size(pLStack_18);
  if (iVar3 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_90,"Must have 1 output",(allocator *)((long)&nnWrite + 7));
    psVar5 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar6 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    errorInCaffeProto(&local_90,psVar5,psVar6);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)((long)&nnWrite + 7));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&top.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d0);
  psVar5 = caffe::LayerParameter::top_abi_cxx11_(pLStack_18,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d0,psVar5);
  local_d4 = caffe::LayerParameter::bottom_size(pLStack_18);
  if ((local_d4 == 1) &&
     (iVar3 = caffe::LayerParameter::blobs_size((LayerParameter *)mappingDataBlobNames), iVar3 != 1)
     ) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f8,"Bias parameters not found.",&local_f9);
    psVar5 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar6 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    errorInCaffeProto(&local_f8,psVar5,psVar6);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  }
  iVar4 = caffe::BiasParameter::axis(local_38);
  if ((((iVar4 == 0) || (iVar4 = caffe::BiasParameter::axis(local_38), iVar4 == -4)) ||
      (iVar4 = caffe::BiasParameter::axis(local_38), iVar4 == 3)) ||
     (iVar4 = caffe::BiasParameter::axis(local_38), iVar4 == -1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"axis",&local_121);
    psVar5 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar6 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    iVar4 = caffe::BiasParameter::axis(local_38);
    std::__cxx11::to_string(&local_148,iVar4);
    unsupportedCaffeParrameterWithOption(&local_120,psVar5,psVar6,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
  }
  iVar4 = caffe::BiasParameter::axis(local_38);
  if (((iVar4 == 1) || (iVar4 = caffe::BiasParameter::axis(local_38), iVar4 == -3)) &&
     (local_d4 == 1)) {
    pBVar7 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    pBVar8 = caffe::BlobProto::shape(pBVar7);
    iVar3 = caffe::BlobShape::dim_size(pBVar8);
    if (iVar3 == 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_168,"Bias of size 2D when axis = 1 is currently not supported",
                 &local_169);
      psVar5 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
      psVar6 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
      errorInCaffeProto(&local_168,psVar5,psVar6);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
    }
  }
  iVar4 = caffe::BiasParameter::axis(local_38);
  if (((iVar4 == 2) || (iVar4 = caffe::BiasParameter::axis(local_38), iVar4 == -2)) &&
     (local_d4 == 1)) {
    pBVar7 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    pBVar8 = caffe::BlobProto::shape(pBVar7);
    iVar3 = caffe::BlobShape::dim_size(pBVar8);
    if (iVar3 == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_190,"Bias of size 1D when axis = 2 is currently not supported",
                 (allocator *)
                 ((long)&biasShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      psVar5 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
      psVar6 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
      errorInCaffeProto(&local_190,psVar5,psVar6);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&biasShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
    }
  }
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)&dimSize);
  local_1b4 = 1;
  if (local_d4 == 1) {
    pBVar7 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    pBVar8 = caffe::BlobProto::shape(pBVar7);
    local_1b8 = caffe::BlobShape::dim_size(pBVar8);
    if (local_1b8 == 0) {
      local_1b4 = 1;
    }
    else if (local_1b8 == 1) {
      pBVar7 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
      pBVar8 = caffe::BlobProto::shape(pBVar7);
      local_1c0 = caffe::BlobShape::dim(pBVar8,0);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&dimSize,&local_1c0);
      pvVar9 = std::vector<long,_std::allocator<long>_>::back
                         ((vector<long,_std::allocator<long>_> *)&dimSize);
      local_1b4 = local_1b4 * (int)*pvVar9;
    }
    else if (local_1b8 == 2) {
      pBVar7 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
      pBVar8 = caffe::BlobProto::shape(pBVar7);
      local_1c8 = caffe::BlobShape::dim(pBVar8,0);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&dimSize,&local_1c8);
      pvVar9 = std::vector<long,_std::allocator<long>_>::back
                         ((vector<long,_std::allocator<long>_> *)&dimSize);
      local_1b4 = local_1b4 * (int)*pvVar9;
      pBVar7 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
      pBVar8 = caffe::BlobProto::shape(pBVar7);
      local_1d0 = caffe::BlobShape::dim(pBVar8,1);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&dimSize,&local_1d0);
      pvVar9 = std::vector<long,_std::allocator<long>_>::back
                         ((vector<long,_std::allocator<long>_> *)&dimSize);
      local_1b4 = local_1b4 * (int)*pvVar9;
    }
    else if ((local_1b8 == 3) || (local_1b8 == 4)) {
      pBVar7 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
      pBVar8 = caffe::BlobProto::shape(pBVar7);
      local_1d8 = caffe::BlobShape::dim(pBVar8,local_1b8 + -3);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&dimSize,&local_1d8);
      pvVar9 = std::vector<long,_std::allocator<long>_>::back
                         ((vector<long,_std::allocator<long>_> *)&dimSize);
      local_1b4 = local_1b4 * (int)*pvVar9;
      pBVar7 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
      pBVar8 = caffe::BlobProto::shape(pBVar7);
      local_1e0 = caffe::BlobShape::dim(pBVar8,local_1b8 + -2);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&dimSize,&local_1e0);
      pvVar9 = std::vector<long,_std::allocator<long>_>::back
                         ((vector<long,_std::allocator<long>_> *)&dimSize);
      local_1b4 = local_1b4 * (int)*pvVar9;
      pBVar7 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
      pBVar8 = caffe::BlobProto::shape(pBVar7);
      local_1e8 = caffe::BlobShape::dim(pBVar8,local_1b8 + -1);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&dimSize,&local_1e8);
      pvVar9 = std::vector<long,_std::allocator<long>_>::back
                         ((vector<long,_std::allocator<long>_> *)&dimSize);
      local_1b4 = local_1b4 * (int)*pvVar9;
      if (local_1b8 == 4) {
        pBVar7 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
        pBVar8 = caffe::BlobProto::shape(pBVar7);
        iVar10 = caffe::BlobShape::dim(pBVar8,0);
        if (iVar10 != 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_208,"bias",&local_209);
          psVar5 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
          psVar6 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_230,"4D bias only supported when 1st dimension is 1",
                     &local_231);
          unsupportedCaffeParrameterWithOption(&local_208,psVar5,psVar6,&local_230);
          std::__cxx11::string::~string((string *)&local_230);
          std::allocator<char>::~allocator((allocator<char> *)&local_231);
          std::__cxx11::string::~string((string *)&local_208);
          std::allocator<char>::~allocator((allocator<char> *)&local_209);
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_258,"bias",&local_259);
      psVar5 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
      psVar6 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_280,">4D bias not supported",&local_281);
      unsupportedCaffeParrameterWithOption(&local_258,psVar5,psVar6,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
    }
    pBVar7 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    iVar3 = caffe::BlobProto::data_size(pBVar7);
    if (iVar3 != local_1b4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2a8,"Bias blob\'s size inconsistent with the blob dimensions",
                 (allocator *)((long)&specLayer + 7));
      psVar5 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
      psVar6 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
      errorInCaffeProto(&local_2a8,psVar5,psVar6);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&specLayer + 7));
    }
  }
  if (local_d4 == 1) {
    this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                        ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
                         layerParameters.protoweights);
    psVar5 = caffe::LayerParameter::bottom_abi_cxx11_(pLStack_18,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&top.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar5);
    psVar5 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    convertCaffeMetadata
              (psVar5,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&top.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d0,
               (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
               layerParameters.protoweights,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)caffeLayerParams);
    this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_bias(this_00);
    __end2 = std::vector<long,_std::allocator<long>_>::begin
                       ((vector<long,_std::allocator<long>_> *)&dimSize);
    dim = (long *)std::vector<long,_std::allocator<long>_>::end
                            ((vector<long,_std::allocator<long>_> *)&dimSize);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                       *)&dim), bVar2) {
      biasWrite = (RepeatedField<float> *)
                  __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                  operator*(&__end2);
      uVar1._0_4_ = biasWrite->current_size_;
      uVar1._4_4_ = biasWrite->total_size_;
      if ((long)uVar1 < 0) {
        __assert_fail("dim >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Bias.cpp"
                      ,0x90,
                      "void CoreMLConverter::convertCaffeBias(CoreMLConverter::ConvertLayerParameters)"
                     );
      }
      value._0_4_ = biasWrite->current_size_;
      value._4_4_ = biasWrite->total_size_;
      CoreML::Specification::BiasLayerParams::add_shape(this_01,value);
      __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                (&__end2);
    }
    this_02 = CoreML::Specification::BiasLayerParams::mutable_bias(this_01);
    local_2e8 = CoreML::Specification::WeightParams::mutable_floatvalue(this_02);
    specLayer_1._4_4_ = 0;
    google::protobuf::RepeatedField<float>::Resize
              (local_2e8,local_1b4,(float *)((long)&specLayer_1 + 4));
    this = local_2e8;
    pBVar7 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    other = caffe::BlobProto::data(pBVar7);
    google::protobuf::RepeatedField<float>::CopyFrom(this,other);
  }
  else {
    local_2f8 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                          ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
                           layerParameters.protoweights);
    psVar5 = caffe::LayerParameter::bottom_abi_cxx11_(pLStack_18,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&top.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar5);
    psVar5 = caffe::LayerParameter::bottom_abi_cxx11_(pLStack_18,1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&top.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar5);
    psVar5 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::operator+(&local_318,psVar5,"_add");
    convertCaffeMetadata
              (&local_318,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&top.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d0,
               (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
               layerParameters.protoweights,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)caffeLayerParams);
    std::__cxx11::string::~string((string *)&local_318);
    CoreML::Specification::NeuralNetworkLayer::mutable_add(local_2f8);
  }
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)&dimSize)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&top.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeBias(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
   
    const caffe::BiasParameter& caffeLayerParams =  caffeLayer.bias_param();
    
    #pragma unused(caffeLayerWeights)
    
    /* CoreML Bias layer does not support all the functionality of Caffe Bias layer.
     Certain error modes can only be detected at compile time when we have input shapes available.
     Such errors cannot be detected at conversion time.
     */
    if (caffeLayer.bottom_size() == 2){
        /*
        WARNING: Caffe Bias layer is currently not fully supported in CoreML.
        Conversion will proceed but certain modes exercised in Caffe may lead to error during compilation/runtime.
        Please refer to the CoreML documentation to see what is supported.
         */
    }
    
    /*
     Caffe can have bias as either an additional input or as a learned parameter. If former, there will be 2 bottoms,
     otherwise 1.
     if bottom_size == 1 => add an CoreML "bias" layer
     if bottom_size == 2 => add an MLkit "add" layer.     
     */
    
    if (! (caffeLayer.bottom_size() == 1 || caffeLayer.bottom_size() == 2)){
        CoreMLConverter::errorInCaffeProto("Must have 1 or 2 input(s)",caffeLayer.name(),caffeLayer.type());
    }
    if (caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 output",caffeLayer.name(),caffeLayer.type());
    }
    
    auto* nnWrite = layerParameters.nnWrite;
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    top.push_back(caffeLayer.top(0));
    
    int nBottom = caffeLayer.bottom_size();
    
    //***************** Some Error Checking in Caffe Proto **********
    if (nBottom == 1){
        if (caffeLayerWeights.blobs_size() != 1){
            CoreMLConverter::errorInCaffeProto("Bias parameters not found.",caffeLayer.name(),caffeLayer.type());
        }
    }
    if (caffeLayerParams.axis() == 0 || caffeLayerParams.axis() == -4 ||
        caffeLayerParams.axis() == 3 || caffeLayerParams.axis() == -1 ) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(),caffeLayer.type(),
                                                             std::to_string(caffeLayerParams.axis()));
    }
    if (caffeLayerParams.axis() == 1 || caffeLayerParams.axis() == -3){
        if (nBottom == 1){
            if (caffeLayerWeights.blobs(0).shape().dim_size() == 2){
                CoreMLConverter::errorInCaffeProto("Bias of size 2D when axis = 1 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    if (caffeLayerParams.axis() == 2 || caffeLayerParams.axis() == -2){
        if (nBottom == 1){
            if (caffeLayerWeights.blobs(0).shape().dim_size() == 1){
                CoreMLConverter::errorInCaffeProto("Bias of size 1D when axis = 2 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    //***************************************************************
    
    /*
     Get params related to bias when it is a learned parameter
     */
    std::vector<int64_t> biasShape;
    int biasSize = 1;
    if (nBottom == 1) {
        
        int dimSize = caffeLayerWeights.blobs(0).shape().dim_size();
        
        if (dimSize == 0){
            biasSize = 1;
        } else if (dimSize == 1){
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(0));
            biasSize *= biasShape.back();
        } else if (dimSize == 2){
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(0));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(1));
            biasSize *= biasShape.back();
        } else if (dimSize == 3 || dimSize == 4){
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-3));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-2));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-1));
            biasSize *= biasShape.back();
            if (dimSize == 4 && caffeLayerWeights.blobs(0).shape().dim(0) != 1) {
                CoreMLConverter::unsupportedCaffeParrameterWithOption("bias",caffeLayer.name(),caffeLayer.type(),
                                                                     "4D bias only supported when 1st dimension is 1");
            }
        } else {
            CoreMLConverter::unsupportedCaffeParrameterWithOption("bias",caffeLayer.name(),caffeLayer.type(),
                                                                 ">4D bias not supported");
        }
        if (caffeLayerWeights.blobs(0).data_size() != biasSize){
            CoreMLConverter::errorInCaffeProto("Bias blob's size inconsistent with the blob dimensions",caffeLayer.name(),caffeLayer.type());
        }
    }
    
    /*
     Add appropriate CoreML layer(s) now
     */
    
    if (nBottom == 1){
        Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
        bottom.push_back(caffeLayer.bottom(0));
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                             bottom, top,
                                             nnWrite, mappingDataBlobNames);
        
        Specification::BiasLayerParams* specLayerParams = specLayer->mutable_bias();
        for (const auto& dim: biasShape){
            assert(dim >= 0);
            specLayerParams->add_shape(static_cast<uint64_t>(dim));
        }
        ::google::protobuf::RepeatedField<float>* biasWrite = specLayerParams->mutable_bias()->mutable_floatvalue();
        biasWrite->Resize(biasSize, 0.0);
        biasWrite->CopyFrom(caffeLayerWeights.blobs(0).data());
    } else {
        Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
        bottom.push_back(caffeLayer.bottom(0));
        bottom.push_back(caffeLayer.bottom(1));
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name() + "_add",
                                             bottom, top,
                                             nnWrite, mappingDataBlobNames);
        (void) specLayer->mutable_add();
    }
}